

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O2

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::PrintArchiveContent
          (ArchiverFactoryImpl *this,IDataBlob *pArchive)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  string _msg;
  DeviceObjectArchive ObjArchive;
  undefined1 local_138 [32];
  string local_118;
  DeviceObjectArchive local_f8;
  
  local_138._8_4_ = 0xffffffff;
  local_138[0xc] = false;
  local_138._0_8_ = pArchive;
  DeviceObjectArchive::DeviceObjectArchive(&local_f8,(CreateInfo *)local_138);
  DeviceObjectArchive::ToString_abi_cxx11_(&local_118,&local_f8);
  FormatString<std::__cxx11::string>((string *)local_138,(Diligent *)&local_118,Args);
  std::__cxx11::string::~string((string *)&local_118);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_138._0_8_,0,0,0);
  }
  std::__cxx11::string::~string((string *)local_138);
  DeviceObjectArchive::~DeviceObjectArchive(&local_f8);
  return true;
}

Assistant:

Bool ArchiverFactoryImpl::PrintArchiveContent(const IDataBlob* pArchive) const
{
    try
    {
        DeviceObjectArchive ObjArchive{DeviceObjectArchive::CreateInfo{pArchive}};

        LOG_INFO_MESSAGE(ObjArchive.ToString());
        return true;
    }
    catch (...)
    {
        return false;
    }
}